

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rewriting.cpp
# Opt level: O0

tuple<NS_*,_NS_*> test_graphs::nat_has_nested(void)

{
  N *this;
  N *pNVar1;
  void *size;
  char *data;
  N *this_00;
  N *pNVar2;
  void *pvVar3;
  _Head_base<0UL,_NS_*,_false> extraout_RDX;
  _Tuple_impl<1UL,_NS_*> in_RDI;
  tuple<NS_*,_NS_*> tVar4;
  N *y_;
  N *x_;
  N *np;
  N *p;
  N *y;
  N *x;
  NS *y_g;
  NS *x_g;
  NS *to_match;
  N *opp;
  N *is;
  N *has;
  N *n3;
  N *n2;
  N *n1;
  NS *g;
  undefined4 in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  NS *in_stack_fffffffffffffe48;
  size_t in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  N *in_stack_fffffffffffffe60;
  void *local_130;
  sockaddr *local_128;
  undefined8 local_120;
  N *local_118;
  void *local_110;
  void *local_108;
  sockaddr *local_100;
  undefined8 local_f8;
  void *local_f0;
  sockaddr *local_e8;
  undefined8 local_e0;
  void *local_d8;
  N *local_d0;
  void *local_c8;
  N *local_c0;
  void *local_b8;
  void *local_b0;
  void *local_a8;
  N *local_a0;
  sockaddr *local_98;
  undefined8 local_90;
  N *local_88;
  sockaddr *local_80;
  undefined8 local_78;
  char *local_70;
  sockaddr *local_68;
  undefined8 local_60;
  void *local_58;
  sockaddr *local_50;
  undefined8 local_48;
  void *local_40;
  N *local_38;
  N *local_30;
  char *local_28;
  void *local_20;
  N *local_18;
  N *local_10;
  
  this = (N *)operator_new(0x18);
  memset(this,0,0x18);
  NS::NS((NS *)0x19adba);
  local_10 = this;
  pNVar1 = (N *)N::operator_new(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  N::N<char_const*>(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  local_18 = pNVar1;
  size = N::operator_new(in_stack_fffffffffffffe50,(NS *)pNVar1);
  N::N<int>(this,in_stack_fffffffffffffe3c);
  local_20 = size;
  data = (char *)N::operator_new((size_t)size,(NS *)pNVar1);
  N::N<int>(this,in_stack_fffffffffffffe3c);
  local_28 = data;
  this_00 = (N *)N::operator_new((size_t)size,(NS *)pNVar1);
  N::N<char_const*>(this_00,data);
  local_30 = this_00;
  pNVar2 = (N *)N::operator_new((size_t)size,(NS *)pNVar1);
  N::N<char_const*>(this_00,data);
  local_38 = pNVar2;
  pvVar3 = N::operator_new((size_t)size,(NS *)pNVar1);
  N::N<char_const*>(this_00,data);
  local_58 = local_20;
  local_50 = (sockaddr *)&local_58;
  local_48 = 1;
  local_40 = pvVar3;
  N::connect(local_18,(int)local_30,local_50,1);
  local_70 = local_28;
  local_68 = (sockaddr *)&local_70;
  local_60 = 1;
  N::connect(local_18,(int)local_30,local_68,1);
  local_88 = local_38;
  local_80 = (sockaddr *)&local_88;
  local_78 = 1;
  N::connect(local_30,(int)local_40,local_80,1);
  local_a0 = local_30;
  local_98 = (sockaddr *)&local_a0;
  local_90 = 1;
  N::connect(local_38,(int)local_40,local_98,1);
  pvVar3 = operator_new(0x18);
  memset(pvVar3,0,0x18);
  NS::NS((NS *)0x19b05e);
  local_a8 = pvVar3;
  pvVar3 = operator_new(0x18);
  memset(pvVar3,0,0x18);
  NS::NS((NS *)0x19b093);
  local_b0 = pvVar3;
  pvVar3 = operator_new(0x18);
  memset(pvVar3,0,0x18);
  NS::NS((NS *)0x19b0c8);
  local_b8 = pvVar3;
  pNVar2 = (N *)N::operator_new((size_t)size,(NS *)pNVar1);
  N::N<NS*>(this,(NS *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  local_c0 = pNVar2;
  pvVar3 = N::operator_new((size_t)size,(NS *)pNVar1);
  N::N<NS*>(this,(NS *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  local_c8 = pvVar3;
  pNVar2 = (N *)N::operator_new((size_t)size,(NS *)pNVar1);
  N::N<char_const*>(this_00,data);
  local_d0 = pNVar2;
  pvVar3 = N::operator_new((size_t)size,(NS *)pNVar1);
  N::N<char_const*>(this_00,data);
  local_f0 = local_c8;
  local_e8 = (sockaddr *)&local_f0;
  local_e0 = 1;
  local_d8 = pvVar3;
  N::connect(local_c0,(int)local_d0,local_e8,1);
  local_108 = local_d8;
  local_100 = (sockaddr *)&local_108;
  local_f8 = 1;
  N::connect(local_d0,(int)local_40,local_100,1);
  pvVar3 = N::operator_new((size_t)size,(NS *)pNVar1);
  N::N<char_const*>(this_00,data);
  local_110 = pvVar3;
  pNVar1 = (N *)N::operator_new((size_t)size,(NS *)pNVar1);
  N::N<char_const*>(this_00,data);
  local_130 = local_110;
  local_128 = (sockaddr *)&local_130;
  local_120 = 1;
  local_118 = pNVar1;
  N::connect(pNVar1,(int)local_d8,local_128,1);
  std::tuple<NS_*,_NS_*>::tuple<NS_*&,_NS_*&,_true>
            ((tuple<NS_*,_NS_*> *)this,
             (NS **)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),(NS **)0x19b31f);
  tVar4.super__Tuple_impl<0UL,_NS_*,_NS_*>.super__Head_base<0UL,_NS_*,_false>._M_head_impl =
       extraout_RDX._M_head_impl;
  tVar4.super__Tuple_impl<0UL,_NS_*,_NS_*>.super__Tuple_impl<1UL,_NS_*>.
  super__Head_base<1UL,_NS_*,_false>._M_head_impl =
       in_RDI.super__Head_base<1UL,_NS_*,_false>._M_head_impl;
  return (tuple<NS_*,_NS_*>)tVar4.super__Tuple_impl<0UL,_NS_*,_NS_*>;
}

Assistant:

std::tuple<NS*, NS*> test_graphs::nat_has_nested() {
    auto g = new NS();
    auto n1 = new(g) N("Nat"), n2 = new(g) N(0), n3 = new(g) N(1);
    auto has = new(g) N("has"), is = new(g) N("is");
    auto opp = new(g) N("opposite");

    n1->connect(has, {n2});
    n1->connect(has, {n3});
    has->connect(opp, {is});
    is->connect(opp, {has});

    auto to_match = new NS(), x_g = new NS(), y_g = new NS();
    auto x = new(to_match) N(x_g), y = new(to_match) N(y_g);
    auto p = new(to_match) N("p"), np = new(to_match) N("np");
    x->connect(p, {y});
    p->connect(opp, {np});

    auto x_ = new(x_g) N("x"), y_ = new(y_g) N("y");
    y_->connect(np, {x_});

    return {g, to_match};
}